

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t maxColumnWidth(FILE *fp)

{
  int iVar1;
  winsize wVar2;
  FILE *local_38;
  size_t ws_col;
  undefined1 local_20 [2];
  ushort local_1e;
  int fdno;
  winsize ws;
  size_t maxcols;
  FILE *fp_local;
  
  ws.ws_row = 0x4f;
  ws.ws_col = 0;
  ws.ws_xpixel = 0;
  ws.ws_ypixel = 0;
  local_38 = (FILE *)fp;
  if (fp == (FILE *)0x0) {
    local_38 = _stdout;
  }
  iVar1 = fileno(local_38);
  memset(local_20,0,8);
  if ((((-1 < iVar1) && (iVar1 = ioctl(iVar1,0x5413,local_20), iVar1 == 0)) &&
      (wVar2.ws_col = 0, wVar2.ws_xpixel = 0, wVar2.ws_ypixel = 0, wVar2.ws_row = local_1e,
      (ulong)ws < (ulong)wVar2)) && ((ulong)wVar2 < 0x100)) {
    ws = (winsize)((long)wVar2 - 1);
  }
  return (size_t)ws;
}

Assistant:

static size_t maxColumnWidth(FILE *fp)
{   
    size_t maxcols = _POPTHELP_MAXLINE;
#if defined(TIOCGWINSZ)
    struct winsize ws;
    int fdno = fileno(fp ? fp : stdout);

    memset(&ws, 0, sizeof(ws));
    if (fdno >= 0 && !ioctl(fdno, (unsigned long)TIOCGWINSZ, &ws)) {
	size_t ws_col = (size_t)ws.ws_col;
	if (ws_col > maxcols && ws_col < (size_t)256)
	    maxcols = ws_col - 1;
    }
#endif
    return maxcols;
}